

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

uint32_t Select(uint32_t a,uint32_t b,uint32_t c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  int pa_minus_pb;
  uint32_t local_20;
  
  iVar1 = Sub3(in_EDI >> 0x18,in_ESI >> 0x18,in_EDX >> 0x18);
  iVar2 = Sub3(in_EDI >> 0x10 & 0xff,in_ESI >> 0x10 & 0xff,in_EDX >> 0x10 & 0xff);
  iVar3 = Sub3(in_EDI >> 8 & 0xff,in_ESI >> 8 & 0xff,in_EDX >> 8 & 0xff);
  iVar4 = Sub3(in_EDI & 0xff,in_ESI & 0xff,in_EDX & 0xff);
  local_20 = in_ESI;
  if (iVar1 + iVar2 + iVar3 + iVar4 < 1) {
    local_20 = in_EDI;
  }
  return local_20;
}

Assistant:

static WEBP_INLINE uint32_t Select(uint32_t a, uint32_t b, uint32_t c) {
  const int pa_minus_pb =
      Sub3((a >> 24)       , (b >> 24)       , (c >> 24)       ) +
      Sub3((a >> 16) & 0xff, (b >> 16) & 0xff, (c >> 16) & 0xff) +
      Sub3((a >>  8) & 0xff, (b >>  8) & 0xff, (c >>  8) & 0xff) +
      Sub3((a      ) & 0xff, (b      ) & 0xff, (c      ) & 0xff);
  return (pa_minus_pb <= 0) ? a : b;
}